

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_byte(lua_State *L)

{
  size_t in_RAX;
  char *pcVar1;
  lua_Integer pos;
  size_t sVar2;
  size_t sVar3;
  size_t in_RCX;
  int space;
  long lVar4;
  ulong uVar5;
  size_t l;
  
  l = in_RAX;
  pcVar1 = luaL_checklstring(L,1,&l);
  pos = luaL_optinteger(L,2,1);
  sVar2 = posrelatI(pos,l);
  sVar3 = getendpos(L,(int)pos,l,in_RCX);
  space = 0;
  uVar5 = sVar3 - sVar2;
  if (sVar2 <= sVar3) {
    if (uVar5 < 0x7fffffff) {
      space = (int)uVar5 + 1;
      luaL_checkstack(L,space,"string slice too long");
      for (lVar4 = 0; lVar4 <= (long)uVar5; lVar4 = lVar4 + 1) {
        lua_pushinteger(L,(ulong)(byte)pcVar1[lVar4 + (sVar2 - 1)]);
      }
    }
    else {
      space = luaL_error(L,"string slice too long");
    }
  }
  return space;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  lua_Integer pi = luaL_optinteger(L, 2, 1);
  size_t posi = posrelatI(pi, l);
  size_t pose = getendpos(L, 3, pi, l);
  int n, i;
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (l_unlikely(pose - posi >= (size_t)INT_MAX))  /* arithmetic overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, cast_uchar(s[posi + cast_uint(i) - 1]));
  return n;
}